

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode set_login(connectdata *conn,char *user,char *passwd,char *options)

{
  bool bVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
    pcVar3 = (*Curl_cstrdup)(user);
    conn->user = pcVar3;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(passwd);
      goto LAB_0011c87d;
    }
  }
  else {
    pcVar3 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar3;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)("ftp@example.com");
      goto LAB_0011c87d;
    }
  }
  pcVar3 = (char *)0x0;
LAB_0011c87d:
  conn->passwd = pcVar3;
  if ((conn->user == (char *)0x0) || (conn->passwd == (char *)0x0)) {
    CVar2 = CURLE_OUT_OF_MEMORY;
    bVar1 = false;
  }
  else {
    CVar2 = CURLE_OK;
    bVar1 = true;
  }
  if (bVar1) {
    if (*options == '\0') {
      CVar2 = CURLE_OK;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(options);
      conn->options = pcVar3;
      CVar2 = CURLE_OUT_OF_MEMORY;
      if (pcVar3 != (char *)0x0) {
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode set_login(struct connectdata *conn,
                          const char *user, const char *passwd,
                          const char *options)
{
  CURLcode result = CURLE_OK;

  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) && !conn->bits.user_passwd) {
    /* Store the default user */
    conn->user = strdup(CURL_DEFAULT_USER);

    /* Store the default password */
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;

    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* Store the user, zero-length if not set */
    conn->user = strdup(user);

    /* Store the password (only if user is present), zero-length if not set */
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }

  if(!conn->user || !conn->passwd)
    result = CURLE_OUT_OF_MEMORY;

  /* Store the options, null if not set */
  if(!result && options[0]) {
    conn->options = strdup(options);

    if(!conn->options)
      result = CURLE_OUT_OF_MEMORY;
  }

  return result;
}